

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cc
# Opt level: O0

bool __thiscall
leveldb::anon_unknown_1::BloomFilterPolicy::KeyMayMatch
          (BloomFilterPolicy *this,Slice *key,Slice *bloom_filter)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  uint uVar7;
  long in_FS_OFFSET;
  uint32_t bitpos;
  size_t j;
  uint32_t delta;
  uint32_t h;
  size_t k;
  size_t bits;
  char *array;
  size_t len;
  Slice *in_stack_ffffffffffffff98;
  Slice *in_stack_ffffffffffffffa8;
  ulong uVar8;
  uint local_4c;
  bool local_9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sVar5 = Slice::size(in_stack_ffffffffffffff98);
  if (sVar5 < 2) {
    local_9 = false;
  }
  else {
    pcVar6 = Slice::data(in_stack_ffffffffffffff98);
    cVar1 = pcVar6[sVar5 - 1];
    if ((ulong)(long)cVar1 < 0x1f) {
      local_4c = BloomHash(in_stack_ffffffffffffffa8);
      uVar4 = local_4c >> 0x11;
      uVar7 = local_4c << 0xf;
      for (uVar8 = 0; uVar8 < (ulong)(long)cVar1; uVar8 = uVar8 + 1) {
        uVar3 = (ulong)local_4c % ((sVar5 - 1) * 8);
        if (((int)pcVar6[uVar3 >> 3 & 0x1fffffff] & 1 << ((byte)uVar3 & 7)) == 0) {
          local_9 = false;
          goto LAB_00d4ad8c;
        }
        local_4c = (uVar4 | uVar7) + local_4c;
      }
      local_9 = true;
    }
    else {
      local_9 = true;
    }
  }
LAB_00d4ad8c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool KeyMayMatch(const Slice& key, const Slice& bloom_filter) const override {
    const size_t len = bloom_filter.size();
    if (len < 2) return false;

    const char* array = bloom_filter.data();
    const size_t bits = (len - 1) * 8;

    // Use the encoded k so that we can read filters generated by
    // bloom filters created using different parameters.
    const size_t k = array[len - 1];
    if (k > 30) {
      // Reserved for potentially new encodings for short bloom filters.
      // Consider it a match.
      return true;
    }

    uint32_t h = BloomHash(key);
    const uint32_t delta = (h >> 17) | (h << 15);  // Rotate right 17 bits
    for (size_t j = 0; j < k; j++) {
      const uint32_t bitpos = h % bits;
      if ((array[bitpos / 8] & (1 << (bitpos % 8))) == 0) return false;
      h += delta;
    }
    return true;
  }